

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O0

void check_variables(void)

{
  _Bool _Var1;
  int iVar2;
  char *local_18;
  retro_variable var;
  
  memset(&local_18,0,0x10);
  local_18 = "gb_color";
  _Var1 = (*env_cb)(0xf,&local_18);
  if ((_Var1) && (var.key != (char *)0x0)) {
    iVar2 = strcmp(var.key,"Gray");
    if (iVar2 == 0) {
      curr_color_scheme = GB_SCREEN_COLORS_GRAY;
    }
    else {
      curr_color_scheme = GB_SCREEN_COLORS_GREEN;
    }
  }
  local_18 = "gb_bootrom_skip";
  _Var1 = (*env_cb)(0xf,&local_18);
  if ((_Var1) && (var.key != (char *)0x0)) {
    iVar2 = strcmp(var.key,"true");
    skip_bootrom = iVar2 == 0;
  }
  return;
}

Assistant:

static void check_variables()
{
   struct retro_variable var = {0};

   var.key = "gb_color";
   if (env_cb(RETRO_ENVIRONMENT_GET_VARIABLE, &var) && var.value)
   {
      if (!strcmp(var.value, "Gray"))
         curr_color_scheme = GB_SCREEN_COLORS_GRAY;
      else
         curr_color_scheme = GB_SCREEN_COLORS_GREEN;
   }

   var.key = "gb_bootrom_skip";
   if (env_cb(RETRO_ENVIRONMENT_GET_VARIABLE, &var) && var.value)
   {
      if (!strcmp(var.value, "true"))
         skip_bootrom = true;
      else
         skip_bootrom = false;
   }
}